

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  undefined1 auVar1 [16];
  double dVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  ImGuiInputSource IVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar14 [16];
  undefined1 auVar18 [64];
  double dVar19;
  float fVar20;
  undefined1 auVar21 [64];
  float local_68;
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pIVar3 = GImGui;
  auVar21._4_60_ = in_register_00001204;
  auVar21._0_4_ = v_speed;
  auVar21 = ZEXT1664(auVar21._0_16_);
  uVar5 = data_type & 0xfffffffe;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    dVar2 = (v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio;
    auVar21 = ZEXT864(CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2));
  }
  uVar10 = (flags & 0x100000U) >> 0x14;
  IVar6 = GImGui->ActiveIdSource;
  auVar14 = auVar21._0_16_;
  if (IVar6 == ImGuiInputSource_Mouse) {
    bVar4 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar4) ||
       (bVar4 = IsMouseDragPastThreshold(0,(pIVar3->IO).MouseDragThreshold * 0.5), !bVar4)) {
      IVar6 = pIVar3->ActiveIdSource;
      auVar21 = ZEXT1664(auVar14);
      goto LAB_0017f0c0;
    }
    fVar20 = (pIVar3->IO).NavInputs[(ulong)uVar10 + 0x1d];
    if ((pIVar3->IO).KeyAlt != false) {
      fVar20 = fVar20 * 0.01;
    }
    fVar11 = auVar21._0_4_;
    if ((pIVar3->IO).KeyShift != false) {
      fVar20 = fVar20 * 10.0;
    }
  }
  else {
LAB_0017f0c0:
    fVar11 = auVar21._0_4_;
    fVar20 = 0.0;
    if (IVar6 == ImGuiInputSource_Nav) {
      uVar7 = 0;
      if (uVar5 == 8) {
        uVar7 = ImParseFormatPrecision(format,3);
      }
      auVar15._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar15._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar15._0_16_);
      fVar20 = *(float *)((long)&local_38 + (ulong)uVar10 * 4);
      if ((int)uVar7 < 0) {
        auVar13 = SUB6416(ZEXT464(0x800000),0);
      }
      else if (uVar7 < 10) {
        auVar13 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar7 * 4));
      }
      else {
        auVar16._0_4_ = powf(10.0,(float)(int)-uVar7);
        auVar16._4_60_ = extraout_var;
        auVar13 = auVar16._0_16_;
      }
      auVar1 = vcmpss_avx(auVar13,auVar14,2);
      auVar14 = vblendvps_avx(auVar13,auVar14,auVar1);
      fVar11 = auVar14._0_4_;
    }
  }
  bVar9 = uVar5 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar20 = fVar20 * fVar11;
  if ((flags & 0x100000U) != 0) {
    fVar20 = -fVar20;
  }
  if (((bVar9 != 0) && (dVar2 = v_max - v_min, dVar2 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar2)) {
    fVar20 = fVar20 / (float)dVar2;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar20)) goto LAB_0017f230;
    bVar4 = fVar20 < 0.0 && *v <= v_min;
  }
  else {
    bVar4 = false;
  }
  if ((pIVar3->ActiveIdIsJustActivated == false) && (!bVar4)) {
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      pIVar3->DragCurrentAccum = fVar20 + pIVar3->DragCurrentAccum;
      pIVar3->DragCurrentAccumDirty = true;
    }
    else if ((pIVar3->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    dVar2 = *v;
    if (bVar9 == 0) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar2 + (double)pIVar3->DragCurrentAccum;
      local_68 = 0.0;
      fVar11 = 0.0;
    }
    else {
      iVar8 = ImParseFormatPrecision(format,3);
      local_68 = powf(0.1,(float)iVar8);
      fVar11 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar2,v_min,v_max,true,local_68,0.0);
      auVar17._0_8_ =
           ScaleValueFromRatioT<double,double,double>
                     (data_type,fVar11 + pIVar3->DragCurrentAccum,v_min,v_max,true,local_68,0.0);
      auVar17._8_56_ = extraout_var_01;
      auVar14 = auVar17._0_16_;
    }
    if ((flags & 0x40U) == 0) {
      auVar18._0_8_ = RoundScalarWithFormatT<double,double>(format,data_type,auVar14._0_8_);
      auVar18._8_56_ = extraout_var_02;
      auVar14 = auVar18._0_16_;
    }
    pIVar3->DragCurrentAccumDirty = false;
    if (bVar9 == 0) {
      dVar2 = *v;
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)(auVar14._0_8_ - dVar2);
    }
    else {
      fVar12 = ScaleRatioFromValueT<double,double,double>
                         (data_type,auVar14._0_8_,v_min,v_max,true,local_68,0.0);
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (fVar12 - fVar11);
      dVar2 = *v;
    }
    auVar13 = vcmpsd_avx(auVar14,ZEXT816(0),0);
    auVar14 = vandnpd_avx(auVar13,auVar14);
    dVar19 = auVar14._0_8_;
    if (v_min < v_max) {
      if ((dVar2 != dVar19) || (NAN(dVar2) || NAN(dVar19))) {
        if ((dVar19 < v_min) || (((uVar5 != 8 && (dVar2 < dVar19)) && (fVar20 < 0.0)))) {
          dVar19 = v_min;
        }
        if ((v_max < dVar19) || (((uVar5 != 8 && (dVar19 < dVar2)) && (0.0 < fVar20)))) {
          dVar19 = v_max;
        }
      }
    }
    if ((dVar2 == dVar19) && (!NAN(dVar2) && !NAN(dVar19))) {
      return false;
    }
    *v = dVar19;
    return true;
  }
LAB_0017f230:
  pIVar3->DragCurrentAccum = 0.0;
  pIVar3->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}